

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

bool gpt_vocab_init(string *fname,gpt_vocab *vocab)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  _Base_ptr p_Var3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  _Stack_58;
  
  printf("%s: loading vocab from \'%s\'\n","gpt_vocab_init",(fname->_M_dataplus)._M_p);
  json_parse((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&_Stack_58,fname);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *)vocab);
  if (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
    p_Var1 = &_Stack_58._M_impl.super__Rb_tree_header;
    (vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_color;
    (vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent;
    (vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left;
    (vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right;
    (_Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &(vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_header;
    (vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         _Stack_58._M_impl.super__Rb_tree_header._M_node_count;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&_Stack_58);
  p_Var3 = (vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      pmVar2 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vocab->id_to_token,(key_type *)(p_Var3 + 2));
      std::__cxx11::string::_M_assign((string *)pmVar2);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  printf("%s: vocab size = %d\n","gpt_vocab_init",
         (ulong)(uint)(vocab->token_to_id)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return true;
}

Assistant:

bool gpt_vocab_init(const std::string & fname, gpt_vocab & vocab) {
    printf("%s: loading vocab from '%s'\n", __func__, fname.c_str());

    vocab.token_to_id = ::json_parse(fname);

    for (const auto & kv : vocab.token_to_id) {
        vocab.id_to_token[kv.second] = kv.first;
    }

    printf("%s: vocab size = %d\n", __func__, (int) vocab.token_to_id.size());

    // print the vocabulary
    //for (auto kv : vocab.token_to_id) {
    //    printf("'%s' -> %d\n", kv.first.data(), kv.second);
    //}

    return true;
}